

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O2

void __thiscall HPack::FieldLookupTable::evictEntry(FieldLookupTable *this)

{
  uint uVar1;
  HeaderField *entry;
  HeaderSize HVar2;
  long in_FS_OFFSET;
  SearchEntry local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->nDynamic != 0) {
    if (this->useIndex == true) {
      backKey(&local_40,this);
      std::
      _Rb_tree<HPack::FieldLookupTable::SearchEntry,_HPack::FieldLookupTable::SearchEntry,_std::_Identity<HPack::FieldLookupTable::SearchEntry>,_std::less<HPack::FieldLookupTable::SearchEntry>,_std::allocator<HPack::FieldLookupTable::SearchEntry>_>
      ::erase(&(this->searchIndex)._M_t,&local_40);
    }
    entry = back(this);
    HVar2 = entry_size(entry);
    this->dataSize = this->dataSize - HVar2.second;
    this->nDynamic = this->nDynamic - 1;
    uVar1 = this->end - 1;
    this->end = uVar1;
    if (uVar1 == this->begin) {
      this->begin = 0x10;
      this->end = 0x10;
    }
    else if ((uVar1 & 0xf) == 0) {
      std::
      deque<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
      ::pop_back(&this->chunks);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FieldLookupTable::evictEntry()
{
    if (!nDynamic)
        return;

    Q_ASSERT(end != begin);

    if (useIndex) {
        const auto res = searchIndex.erase(backKey());
        Q_UNUSED(res);
        Q_ASSERT(res == 1);
    }

    const HeaderField &field = back();
    const auto entrySize = entry_size(field);
    Q_ASSERT(entrySize.first);
    Q_ASSERT(dataSize >= entrySize.second);
    dataSize -= entrySize.second;

    --nDynamic;
    --end;

    if (end == begin) {
        Q_ASSERT(chunks.size() == 1);
        end = ChunkSize;
        begin = end;
    } else if (!(end % ChunkSize)) {
        chunks.pop_back();
    }
}